

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.cpp
# Opt level: O3

shared_ptr<const_pstore::repo::compilation> __thiscall
pstore::repo::compilation::load
          (compilation *this,database *db,extent<pstore::repo::compilation> *location)

{
  int iVar1;
  long *plVar2;
  shared_ptr<const_pstore::repo::compilation> sVar3;
  error_code eVar4;
  error_code erc;
  
  sVar3 = database::getro<pstore::repo::compilation,void>
                    ((database *)this,(extent<pstore::repo::compilation> *)db);
  plVar2 = *(long **)(this->signature_)._M_elems;
  if ((*plVar2 == 0x6e6f69386c706d43) &&
     (iVar1 = (int)plVar2[2], (ulong)(iVar1 + (uint)(iVar1 == 0)) * 0x30 + 0x20 == location->size))
  {
    sVar3.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this;
    return (shared_ptr<const_pstore::repo::compilation>)
           sVar3.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>;
  }
  eVar4 = make_error_code(bad_compilation_record);
  erc._M_cat = eVar4._M_cat;
  erc._0_8_ = erc._M_cat;
  raise_error_code<std::error_code>((pstore *)(ulong)(uint)eVar4._M_value,erc);
}

Assistant:

auto compilation::load (pstore::database const & db, pstore::extent<compilation> const & location)
    -> std::shared_ptr<compilation const> {
    std::shared_ptr<compilation const> t = db.getro (location);
#if PSTORE_SIGNATURE_CHECKS_ENABLED
    if (t->signature_ != compilation_signature_) {
        raise_error_code (make_error_code (error_code::bad_compilation_record));
    }
#endif
    if (t->size_bytes () != location.size) {
        raise_error_code (make_error_code (error_code::bad_compilation_record));
    }
    return t;
}